

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddArchitectureFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  reference pbVar5;
  allocator local_211;
  string local_210;
  string local_1f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  iterator i;
  char *deploymentTargetFlag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string deploymentTargetFlagVar;
  string local_148;
  char *local_128;
  char *deploymentTarget;
  char *sysrootFlag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string sysrootFlagVar;
  string local_a8;
  char *local_88;
  char *sysroot;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archs;
  allocator local_51;
  string local_50;
  string *local_30;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_30 = config;
  config_local = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"APPLE",&local_51);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((((bVar2 ^ 0xffU) & 1) == 0) && ((this->EmitUniversalBinaryFlags & 1U) != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sysroot);
    cmGeneratorTarget::GetAppleArchs
              ((cmGeneratorTarget *)lang_local,local_30,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sysroot);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,"CMAKE_OSX_SYSROOT",
               (allocator *)(sysrootFlagVar.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(sysrootFlagVar.field_2._M_local_buf + 0xf))
    ;
    local_88 = pcVar3;
    if ((pcVar3 != (char *)0x0) && ((*pcVar3 == '/' && (pcVar3[1] == '\0')))) {
      local_88 = (char *)0x0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,"CMAKE_",(allocator *)((long)&sysrootFlag + 7));
    std::operator+(&local_f0,&local_110,config_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,"_SYSROOT_FLAG");
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysrootFlag + 7));
    deploymentTarget = cmMakefile::GetDefinition(this->Makefile,(string *)local_d0);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"CMAKE_OSX_DEPLOYMENT_TARGET",
               (allocator *)(deploymentTargetFlagVar.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)(deploymentTargetFlagVar.field_2._M_local_buf + 0xf));
    local_128 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1b0,"CMAKE_",(allocator *)((long)&deploymentTargetFlag + 7));
    std::operator+(&local_190,&local_1b0,config_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   &local_190,"_OSX_DEPLOYMENT_TARGET_FLAG");
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&deploymentTargetFlag + 7));
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmMakefile::GetDefinition(this->Makefile,(string *)local_170);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&sysroot);
    if (((!bVar2) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) &&
       ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)config_local), *pcVar3 == 'C' ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)config_local), *pcVar3 == 'F'))))
    {
      local_1c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&sysroot);
      while( true ) {
        local_1d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&sysroot);
        bVar2 = __gnu_cxx::operator!=(&local_1c8,&local_1d0);
        if (!bVar2) break;
        std::__cxx11::string::operator+=((string *)target_local," -arch ");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_1c8);
        std::__cxx11::string::operator+=((string *)target_local,(string *)pbVar5);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1c8);
      }
    }
    if ((((deploymentTarget != (char *)0x0) && (*deploymentTarget != '\0')) &&
        (local_88 != (char *)0x0)) && (*local_88 != '\0')) {
      std::__cxx11::string::operator+=((string *)target_local," ");
      std::__cxx11::string::operator+=((string *)target_local,deploymentTarget);
      std::__cxx11::string::operator+=((string *)target_local," ");
      pcVar3 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,pcVar3,&local_211);
      cmOutputConverter::Convert(&local_1f0,&this->super_cmOutputConverter,&local_210,NONE,SHELL);
      std::__cxx11::string::operator+=((string *)target_local,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
    if (((i._M_current != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        && ((i._M_current)->_M_dataplus != (_Alloc_hider)0x0)) &&
       ((local_128 != (char *)0x0 && (*local_128 != '\0')))) {
      std::__cxx11::string::operator+=((string *)target_local," ");
      std::__cxx11::string::operator+=((string *)target_local,(char *)i._M_current);
      std::__cxx11::string::operator+=((string *)target_local,local_128);
    }
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sysroot);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddArchitectureFlags(std::string& flags,
                                            cmGeneratorTarget const* target,
                                            const std::string& lang,
                                            const std::string& config)
{
  // Only add Mac OS X specific flags on Darwin platforms (OSX and iphone):
  if(!this->Makefile->IsOn("APPLE"))
    {
    return;
    }

  if(this->EmitUniversalBinaryFlags)
    {
    std::vector<std::string> archs;
    target->GetAppleArchs(config, archs);
    const char* sysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    if(sysroot && sysroot[0] == '/' && !sysroot[1])
      { sysroot = 0; }
    std::string sysrootFlagVar =
      std::string("CMAKE_") + lang + "_SYSROOT_FLAG";
    const char* sysrootFlag =
      this->Makefile->GetDefinition(sysrootFlagVar);
    const char* deploymentTarget =
      this->Makefile->GetDefinition("CMAKE_OSX_DEPLOYMENT_TARGET");
    std::string deploymentTargetFlagVar =
      std::string("CMAKE_") + lang + "_OSX_DEPLOYMENT_TARGET_FLAG";
    const char* deploymentTargetFlag =
      this->Makefile->GetDefinition(deploymentTargetFlagVar);
    if(!archs.empty() && !lang.empty() && (lang[0] =='C' || lang[0] == 'F'))
      {
      for(std::vector<std::string>::iterator i = archs.begin();
          i != archs.end(); ++i)
        {
        flags += " -arch ";
        flags += *i;
        }
      }

    if(sysrootFlag && *sysrootFlag && sysroot && *sysroot)
      {
      flags += " ";
      flags += sysrootFlag;
      flags += " ";
      flags += this->Convert(sysroot, NONE, SHELL);
      }

    if (deploymentTargetFlag && *deploymentTargetFlag &&
        deploymentTarget && *deploymentTarget)
      {
      flags += " ";
      flags += deploymentTargetFlag;
      flags += deploymentTarget;
      }
    }
}